

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cmd.c
# Opt level: O2

int cfg_cmd_handle_remove(cfg_instance *instance,cfg_db *db,char *arg,autobuf *log)

{
  int iVar1;
  int iVar2;
  char *arg_00;
  char *fmt;
  _parsed_argument pa;
  
  arg_00 = strdup(arg);
  if (arg_00 == (char *)0x0) {
    return -1;
  }
  iVar1 = _do_parse_arg(arg_00,&pa,log);
  if (iVar1 == 0) {
    if (pa.entry_value == (char *)0x0) {
      if (pa.entry_key == (char *)0x0) {
        if (((pa.section_name == (char *)0x0) ||
            (iVar1 = cfg_db_remove_namedsection(db,pa.section_type,pa.section_name), iVar1 == 0)) &&
           ((iVar1 = 0, pa.section_type == (char *)0x0 ||
            (iVar2 = cfg_db_remove_sectiontype(db,pa.section_type), iVar2 == 0))))
        goto LAB_00129430;
        fmt = "Cannot remove section: \'%s\'\n";
      }
      else {
        iVar1 = cfg_db_remove_entry(db,pa.section_type,pa.section_name,pa.entry_key);
        if (iVar1 == 0) {
          iVar1 = 0;
          goto LAB_00129430;
        }
        fmt = "Cannot remove entry: \'%s\'\n";
      }
    }
    else {
      fmt = "Value is not allowed for remove command: %s";
    }
    cfg_append_printable_line(log,fmt,arg);
  }
  iVar1 = -1;
LAB_00129430:
  free(arg_00);
  return iVar1;
}

Assistant:

int
cfg_cmd_handle_remove(
  struct cfg_instance *instance __attribute__((unused)), struct cfg_db *db, const char *arg, struct autobuf *log) {
  struct _parsed_argument pa;
  char *ptr;
  int result;

  /* get temporary copy of argument string */
  ptr = strdup(arg);
  if (!ptr)
    return -1;

  /* prepare for cleanup */
  result = -1;

  if (_do_parse_arg(ptr, &pa, log)) {
    goto handle_remove_cleanup;
  }

  if (pa.entry_value != NULL) {
    cfg_append_printable_line(log, "Value is not allowed for remove command: %s", arg);
    goto handle_remove_cleanup;
  }

  if (pa.entry_key != NULL) {
    if (!cfg_db_remove_entry(db, pa.section_type, pa.section_name, pa.entry_key)) {
      result = 0;
    }
    else {
      cfg_append_printable_line(log, "Cannot remove entry: '%s'\n", arg);
    }
    goto handle_remove_cleanup;
  }

  if (pa.section_name) {
    if (cfg_db_remove_namedsection(db, pa.section_type, pa.section_name)) {
      cfg_append_printable_line(log, "Cannot remove section: '%s'\n", arg);
      goto handle_remove_cleanup;
    }
  }

  if (pa.section_type) {
    if (cfg_db_remove_sectiontype(db, pa.section_type)) {
      cfg_append_printable_line(log, "Cannot remove section: '%s'\n", arg);
      goto handle_remove_cleanup;
    }
  }
  result = 0;

handle_remove_cleanup:
  free(ptr);
  return result;
}